

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

pair<unsigned_char,_unsigned_char> __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
::find_position<int>
          (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
           *this,int *key)

{
  size_type sVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_RSI;
  undefined8 in_RDI;
  size_type insert_pos;
  size_type bucknum;
  size_type bucket_count_minus_one;
  size_type num_probes;
  undefined7 in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffcf;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  byte bVar5;
  char cVar6;
  pair<unsigned_char,_unsigned_char> local_2;
  
  cVar6 = '\0';
  sVar1 = bucket_count((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                        *)0x10538b2);
  bVar2 = sVar1 - 1;
  bVar3 = hash<int>(in_stack_ffffffffffffffd0,
                    (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar3 = bVar3 & bVar2;
  bVar5 = 0xff;
  do {
    bVar4 = sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
            ::test((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                    *)CONCAT17(cVar6,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar5,
                                                  in_stack_ffffffffffffffe0)))),
                   (size_type)((ulong)in_RDI >> 0x38));
    if (!bVar4) {
      if (bVar5 == 0xff) {
        std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char_&,_true>
                  (&local_2,&sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                             ::ILLEGAL_BUCKET,&stack0xffffffffffffffe5);
      }
      else {
        std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char_&,_true>
                  (&local_2,&sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                             ::ILLEGAL_BUCKET,&stack0xffffffffffffffe4);
      }
      return local_2;
    }
    bVar4 = test_deleted(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    if (bVar4) {
      if (bVar5 == 0xff) {
        bVar5 = bVar3;
      }
    }
    else {
      in_stack_ffffffffffffffd0 = in_RSI;
      sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::
      unsafe_get((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                  *)CONCAT17(cVar6,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar5,
                                                  in_stack_ffffffffffffffe0)))),
                 (size_type)((ulong)in_RDI >> 0x38));
      get_key(in_stack_ffffffffffffffd0,
              (const_reference)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      bVar4 = sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
              ::equals<int,int>(in_stack_ffffffffffffffd0,
                                (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                                ,(int *)0x105399e);
      if (bVar4) {
        std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char_&,_true>
                  (&local_2,&stack0xffffffffffffffe5,
                   &sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                    ::ILLEGAL_BUCKET);
        return local_2;
      }
    }
    cVar6 = cVar6 + '\x01';
    bVar3 = bVar3 + cVar6 & bVar2;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }